

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

bool __thiscall AActor::IsOkayToAttack(AActor *this,AActor *link)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  AActor *pAVar4;
  bool bVar5;
  bool local_84;
  bool local_83;
  undefined1 local_70 [16];
  DAngle angle;
  TFlags<ActorFlag,_unsigned_int> local_58;
  TFlags<ActorFlag,_unsigned_int> local_54;
  TFlags<ActorFlag5,_unsigned_int> local_50;
  TFlags<ActorFlag,_unsigned_int> local_4c;
  TFlags<ActorFlag2,_unsigned_int> local_48;
  TFlags<ActorFlag5,_unsigned_int> local_44;
  AActor *local_40;
  AActor *Friend;
  TFlags<ActorFlag,_unsigned_int> local_30;
  TFlags<ActorFlag3,_unsigned_int> local_2c;
  TFlags<ActorFlag2,_unsigned_int> local_28;
  TFlags<ActorFlag5,_unsigned_int> local_24;
  AActor *local_20;
  AActor *link_local;
  AActor *this_local;
  
  bVar5 = true;
  iVar1 = (int)this;
  local_20 = link;
  link_local = this;
  if (this->player == (player_t *)0x0) {
    TFlags<ActorFlag5,_unsigned_int>::operator&
              (&local_24,
               iVar1 + (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_NODAMAGE|MF5_NOFORWARDFALL|MF5_NODROPOFF
                       ));
    uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_24);
    bVar5 = true;
    if (uVar2 == 0) {
      TFlags<ActorFlag2,_unsigned_int>::operator&
                (&local_28,iVar1 + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
      uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_28);
      bVar5 = uVar2 != 0;
    }
  }
  if ((bVar5) && (local_20 != this)) {
    bVar5 = true;
    if (local_20->player == (player_t *)0x0) {
      TFlags<ActorFlag3,_unsigned_int>::operator&
                (&local_2c,
                 (int)local_20 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
      uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_2c);
      bVar5 = uVar2 != 0;
    }
    if (bVar5) {
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_30,
                 (int)local_20 +
                 (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE))
      ;
      uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_30);
      if (uVar2 != 0) {
        TFlags<ActorFlag2,_unsigned_int>::operator&
                  ((TFlags<ActorFlag2,_unsigned_int> *)((long)&Friend + 4),
                   (int)local_20 + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
        uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&Friend + 4));
        if (uVar2 == 0) {
          local_40 = (AActor *)0x0;
          pAVar4 = this;
          if (this->player == (player_t *)0x0) {
            TFlags<ActorFlag5,_unsigned_int>::operator&
                      (&local_44,
                       iVar1 + (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_NODAMAGE|MF5_NOFORWARDFALL|
                               MF5_NODROPOFF));
            uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_44);
            if (uVar2 == 0) {
              TFlags<ActorFlag2,_unsigned_int>::operator&
                        (&local_48,iVar1 + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
              uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_48);
              if (uVar2 == 0) {
                TFlags<ActorFlag,_unsigned_int>::operator&
                          (&local_4c,
                           iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|
                                    MF_NOSECTOR|MF_SHOOTABLE));
                uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_4c);
                bVar5 = false;
                if (uVar2 != 0) {
                  bVar5 = this->FriendPlayer != '\0';
                }
                pAVar4 = local_40;
                if (bVar5) {
                  pAVar4 = (AActor *)(&players)[(long)(int)(this->FriendPlayer - 1) * 0x54];
                }
              }
              else {
                pAVar4 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->target);
              }
            }
            else {
              pAVar4 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->tracer);
            }
          }
          local_40 = pAVar4;
          if (((local_20 != local_40) && (local_40 != (AActor *)0x0)) &&
             (bVar5 = IsFriend(local_40,local_20), !bVar5)) {
            TFlags<ActorFlag5,_unsigned_int>::operator&
                      (&local_50,
                       (int)local_20 +
                       (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_NODAMAGE|MF5_NOFORWARDFALL|MF5_NODROPOFF
                       ));
            uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_50);
            local_83 = false;
            if (uVar2 != 0) {
              local_83 = TObjPtr<AActor>::operator==(&local_20->tracer,local_40);
            }
            if ((local_83 == false) &&
               ((((multiplayer & 1U) == 0 ||
                 (iVar3 = FIntCVar::operator_cast_to_int(&deathmatch), iVar3 != 0)) ||
                ((local_20->player == (player_t *)0x0 || (local_40->player == (player_t *)0x0))))))
            {
              TFlags<ActorFlag,_unsigned_int>::TFlags
                        ((TFlags<ActorFlag,_unsigned_int> *)((long)&angle.Degrees + 4),
                         &local_20->flags);
              TFlags<ActorFlag,_unsigned_int>::operator&(&local_58,&this->flags);
              TFlags<ActorFlag,_unsigned_int>::operator&(&local_54,(ActorFlag)&local_58);
              uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_54);
              local_84 = false;
              if (uVar2 != 0) {
                local_84 = IsFriend(this,local_20);
              }
              if ((local_84 == false) && (bVar5 = P_CheckSight(this,local_20,0), bVar5)) {
                TFlags<ActorFlag3,_unsigned_int>::operator&
                          ((TFlags<ActorFlag3,_unsigned_int> *)&angle,
                           iVar1 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG)
                          );
                uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&angle);
                if (uVar2 == 0) {
                  return true;
                }
                AngleTo((AActor *)local_70,local_40,SUB81(local_20,0));
                absangle<double>((TAngle<double> *)(local_70 + 8),(TAngle<double> *)local_70);
                bVar5 = TAngle<double>::operator<
                                  ((TAngle<double> *)(local_70 + 8),21.333333333333336);
                if (bVar5) {
                  return true;
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool AActor::IsOkayToAttack (AActor *link)
{
	if (!(player							// Original AActor::IsOkayToAttack was only for players
	//	|| (flags  & MF_FRIENDLY)			// Maybe let friendly monsters use the function as well?
		|| (flags5 & MF5_SUMMONEDMONSTER)	// AMinotaurFriend has its own version, generalized to other summoned monsters
		|| (flags2 & MF2_SEEKERMISSILE)))	// AHolySpirit and AMageStaffFX2 as well, generalized to other seeker missiles
	{	// Normal monsters and other actors always return false.
		return false;
	}
	// Standard things to eliminate: an actor shouldn't attack itself,
	// or a non-shootable, dormant, non-player-and-non-monster actor.
	if (link == this)									return false;
	if (!(link->player||(link->flags3 & MF3_ISMONSTER)))return false;
	if (!(link->flags & MF_SHOOTABLE))					return false;
	if (link->flags2 & MF2_DORMANT)						return false;

	// An actor shouldn't attack friendly actors. The reference depends
	// on the type of actor: for a player's actor, itself; for a projectile,
	// its target; and for a summoned minion, its tracer.
	AActor * Friend = NULL;
	if (player)											Friend = this;
	else if (flags5 & MF5_SUMMONEDMONSTER)				Friend = tracer;
	else if (flags2 & MF2_SEEKERMISSILE)				Friend = target;
	else if ((flags & MF_FRIENDLY) && FriendPlayer)		Friend = players[FriendPlayer-1].mo;

	// Friend checks
	if (link == Friend)									return false;
	if (Friend == NULL)									return false;
	if (Friend->IsFriend(link))							return false;
	if ((link->flags5 & MF5_SUMMONEDMONSTER)			// No attack against minions on the same side
		&& (link->tracer == Friend))					return false;
	if (multiplayer && !deathmatch						// No attack against fellow players in coop
		&& link->player && Friend->player)				return false;
	if (((flags & link->flags) & MF_FRIENDLY)			// No friendly infighting amongst minions
		&& IsFriend(link))								return false;

	// Now that all the actor checks are made, the line of sight can be checked
	if (P_CheckSight (this, link))
	{
		// AMageStaffFX2::IsOkayToAttack had an extra check here, generalized with a flag,
		// to only allow the check to succeed if the enemy was in a ~84� FOV of the player
		if (flags3 & MF3_SCREENSEEKER)
		{
			DAngle angle = absangle(Friend->AngleTo(link), Friend->Angles.Yaw);
			if (angle < 30 * (256./360.))
			{
				return true;
			}
		}
		// Other actors are not concerned by this check
		else return true;
	}
	// The sight check was failed, or the angle wasn't right for a screenseeker
	return false;
}